

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  xmlParserErrors code;
  uint uVar3;
  uint val;
  int iVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int l;
  xmlParserCtxtPtr local_38;
  
  iVar8 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    iVar8 = 50000;
  }
  bVar1 = *ctxt->input->cur;
  uVar3 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      pxVar6 = (xmlChar *)0x0;
      code = XML_ERR_LITERAL_NOT_STARTED;
LAB_00135725:
      xmlFatalErr(ctxt,code,(char *)0x0);
      return pxVar6;
    }
    uVar3 = 0x27;
  }
  xmlNextChar(ctxt);
  pxVar6 = (xmlChar *)(*xmlMalloc)(100);
  if (pxVar6 != (xmlChar *)0x0) {
    iVar5 = 0;
    iVar9 = 100;
    local_38 = ctxt;
    do {
      val = xmlCurrentCharRecover(ctxt,&l);
      if ((int)val < 0x100) {
        if (((int)val < 0x20) && ((0xd < val || ((0x2600U >> (val & 0x1f) & 1) == 0)))) {
          pxVar6[iVar5] = '\0';
LAB_001357c9:
          code = XML_ERR_LITERAL_NOT_FINISHED;
          goto LAB_00135725;
        }
        if (val == uVar3) {
          pxVar6[iVar5] = '\0';
LAB_00135772:
          xmlNextChar(ctxt);
          return pxVar6;
        }
      }
      else if ((val == uVar3) ||
              ((val - 0xfffe < 0xffffe002 && val - 0x110000 < 0xfff00000) && 0xd7ff < val)) {
        pxVar6[iVar5] = '\0';
        if (val - 0x10000 < 0x100000 || (val - 0xe000 < 0x1ffe || val < 0xd800)) goto LAB_00135772;
        goto LAB_001357c9;
      }
      pxVar7 = pxVar6;
      if (iVar9 <= iVar5 + 5) {
        iVar4 = 1;
        if (0 < iVar9) {
          if (iVar8 <= iVar9) {
            xmlFatalErr(local_38,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
            (*xmlFree)(pxVar6);
            return (xmlChar *)0x0;
          }
          uVar10 = iVar9 + 1U >> 1;
          iVar4 = uVar10 + iVar9;
          if ((int)(iVar8 - uVar10) < iVar9) {
            iVar4 = iVar8;
          }
        }
        iVar9 = iVar4;
        pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,(size_t)iVar9);
        ctxt = local_38;
        if (pxVar7 == (xmlChar *)0x0) goto LAB_0013577c;
      }
      if (val < 0x80) {
        pxVar7[iVar5] = (xmlChar)val;
        iVar5 = iVar5 + 1;
      }
      else {
        iVar4 = xmlCopyCharMultiByte(pxVar7 + iVar5,val);
        iVar5 = iVar4 + iVar5;
      }
      pxVar2 = ctxt->input;
      if (*pxVar2->cur == '\n') {
        pxVar2->line = pxVar2->line + 1;
        pxVar2->col = 1;
      }
      else {
        pxVar2->col = pxVar2->col + 1;
      }
      pxVar2->cur = pxVar2->cur + l;
      pxVar6 = pxVar7;
    } while( true );
  }
LAB_00135785:
  xmlCtxtErrMemory(ctxt);
  return (xmlChar *)0x0;
LAB_0013577c:
  (*xmlFree)(pxVar6);
  goto LAB_00135785;
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar stop;

    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = xmlMalloc(size);
    if (buf == NULL) {
        xmlErrMemory(ctxt);
	return(NULL);
    }
    cur = xmlCurrentCharRecover(ctxt, &l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize < 0) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
                xmlFree(buf);
                return(NULL);
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	COPY_BUF(buf, len, cur);
	NEXTL(l);
	cur = xmlCurrentCharRecover(ctxt, &l);
    }
    buf[len] = 0;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}